

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v10::detail::
         do_write_float<fmt::v10::appender,fmt::v10::detail::big_decimal_fp,char,fmt::v10::detail::digit_grouping<char>>
                   (appender out,big_decimal_fp *f,format_specs<char> *specs,float_specs fspecs,
                   locale_ref loc)

{
  char cVar1;
  sign_t sVar2;
  undefined1 uVar3;
  float_specs fVar4;
  byte bVar5;
  int iVar6;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  appender aVar9;
  undefined8 uVar10;
  sign_t *psVar11;
  ulong uVar12;
  sign_t *psVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  size_t sVar17;
  ulong uVar18;
  char decimal_point;
  sign_t sign;
  char zero;
  bool pointy;
  int significand_size;
  int exp;
  char *significand;
  anon_class_40_8_dbbf3351 write;
  int num_zeros;
  undefined1 local_d7 [3];
  byte local_d4 [4];
  float_specs local_d0;
  int local_c8;
  int local_c4;
  float_specs local_c0;
  undefined1 local_b8 [20];
  undefined1 auStack_a4 [20];
  float_specs *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  char *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  digit_grouping<char> *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_c0 = (float_specs)f->significand;
  local_c8 = f->significand_size;
  local_d7[2] = '0';
  local_d0._4_4_ = fspecs._4_4_;
  local_d7[1] = fspecs._5_1_;
  fVar4 = fspecs;
  if (local_c8 < 0) goto LAB_00116019;
  uVar18 = (ulong)((local_c8 + 1) - (uint)(local_d7[1] == 0));
  local_d7[0] = '.';
  uVar15 = (uint)local_d0._4_4_ >> 0x11;
  local_d0 = fspecs;
  if ((uVar15 & 1) != 0) {
    local_d7[0] = decimal_point_impl<char>(loc);
  }
  uVar10 = auStack_a4._4_8_;
  uVar15 = f->exponent;
  local_c4 = local_c8 + uVar15;
  if (local_d0._4_1_ == '\x01') {
LAB_00115cd7:
    iVar14 = local_c8 + uVar15 + -1;
    if (((uint)local_d0._4_4_ >> 0x13 & 1) == 0) {
      uVar12 = 0;
      if (local_c8 == 1) {
        local_d7[0] = '\0';
      }
    }
    else {
      uVar12 = 0;
      if (0 < local_d0.precision - local_c8) {
        uVar12 = (ulong)(uint)(local_d0.precision - local_c8);
      }
      uVar18 = uVar18 + uVar12;
    }
    local_b8[0] = local_d7[1];
    local_b8._8_8_ = local_c0;
    auStack_a4[0] = local_d7[0];
    local_b8._16_4_ = local_c8;
    auStack_a4._4_5_ = CONCAT14('0',(int)uVar12);
    auStack_a4._10_2_ = SUB82(uVar10,6);
    auStack_a4._4_8_ =
         CONCAT26(auStack_a4._10_2_,
                  CONCAT15((((uint)local_d0._4_4_ >> 0x10 & 1) == 0) << 5,auStack_a4._4_5_)) |
         0x450000000000;
    auStack_a4._12_4_ = iVar14;
    if (specs->width < 1) {
      if ((ulong)(byte)local_d7[1] != 0) {
        cVar1 = ""[(byte)local_d7[1]];
        if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                             container + 0x18) <
            *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                            container + 0x10) + 1U) {
          (*(code *)**(undefined8 **)
                      out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
                    (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
        }
        lVar16 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                 container + 0x10);
        *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                 0x10) = lVar16 + 1;
        *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                  container + 8) + lVar16) = cVar1;
      }
      bVar7.container =
           (buffer<char> *)
           write_significand<fmt::v10::appender,char>
                     (out,(char *)local_b8._8_8_,local_b8._16_4_,1,auStack_a4[0]);
      if (0 < (int)auStack_a4._4_4_) {
        bVar7.container =
             (buffer<char> *)
             fill_n<fmt::v10::appender,int,char>
                       ((appender)bVar7.container,auStack_a4._4_4_,auStack_a4 + 8);
      }
      uVar3 = auStack_a4[9];
      if ((bVar7.container)->capacity_ < (bVar7.container)->size_ + 1) {
        (**(bVar7.container)->_vptr_buffer)(bVar7.container);
      }
      sVar17 = (bVar7.container)->size_;
      (bVar7.container)->size_ = sVar17 + 1;
      (bVar7.container)->ptr_[sVar17] = uVar3;
      bVar7.container =
           (buffer<char> *)
           write_exponent<char,fmt::v10::appender>(auStack_a4._12_4_,bVar7.container);
    }
    else {
      if (local_c4 < 1) {
        iVar14 = 1 - local_c4;
      }
      lVar16 = 2;
      if (99 < iVar14) {
        lVar16 = (ulong)(999 < iVar14) + 3;
      }
      sVar17 = uVar18 + (3 - (ulong)(local_d7[0] == '\0')) + lVar16;
      bVar7.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::big_decimal_fp,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::big_decimal_fp_const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_1_&>
                     (out,specs,sVar17,sVar17,(anon_class_40_8_dbbf3351 *)local_b8);
    }
  }
  else {
    if (((ulong)local_d0 & 0xff00000000) == 0) {
      iVar14 = 0x10;
      if (0 < local_d0.precision) {
        iVar14 = local_d0.precision;
      }
      if ((local_c4 < -3) || (iVar14 < local_c4)) goto LAB_00115cd7;
    }
    if ((int)uVar15 < 0) {
      if (local_c4 < 1) {
        iVar6 = -local_c4;
        iVar14 = iVar6;
        if (SBORROW4(local_d0.precision,iVar6) != local_d0.precision + local_c4 < 0) {
          iVar14 = local_d0.precision;
        }
        if (local_d0.precision < 0) {
          iVar14 = iVar6;
        }
        if (local_c8 != 0) {
          iVar14 = iVar6;
        }
        local_70._M_allocated_capacity._0_4_ = iVar14;
        bVar5 = 1;
        if (local_c8 == 0 && iVar14 == 0) {
          bVar5 = (local_d0._6_1_ & 8) >> 3;
        }
        local_d4[0] = bVar5;
        fVar4 = local_d0;
        if (-1 < iVar14) {
          sVar17 = ((uint)bVar5 + iVar14 + 1) + uVar18;
          local_b8._0_8_ = local_d7 + 1;
          local_b8._8_8_ = local_d7 + 2;
          unique0x00004e80 = local_d7 + 3;
          auStack_a4._4_8_ = local_d7;
          auStack_a4._12_8_ = &local_70;
          local_90 = &local_c0;
          local_88._M_allocated_capacity = (size_type)&local_c8;
          aVar9 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::big_decimal_fp,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::big_decimal_fp_const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_4_&>
                            (out,specs,sVar17,sVar17,(anon_class_56_7_162c6e41 *)local_b8);
          return (appender)
                 aVar9.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.
                 container;
        }
LAB_00116019:
        local_d0 = fVar4;
        assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/evaikene[P]filefind/fmt/core.h"
                    ,0x178,"negative value");
      }
      uVar15 = local_d0.precision - local_c8 & (int)(local_d0._4_4_ << 0xc) >> 0x1f;
      local_d4 = (byte  [4])uVar15;
      digit_grouping<char>::digit_grouping
                ((digit_grouping<char> *)local_b8,loc,
                 (bool)((byte)((uint)local_d0._4_4_ >> 0x11) & 1));
      psVar13 = (sign_t *)((long)(int *)local_b8._8_8_ + local_b8._0_8_);
      iVar14 = 0;
      if ((int)uVar15 < 1) {
        uVar15 = 0;
      }
      sVar17 = uVar15 + uVar18;
      psVar11 = (sign_t *)local_b8._0_8_;
      do {
        iVar6 = 0x7fffffff;
        if (local_90 != (float_specs *)0x0) {
          if (psVar11 == psVar13) {
            uVar15 = (uint)(char)psVar13[-1];
          }
          else {
            sVar2 = *psVar11;
            if ((byte)(sVar2 + 0x81) < 0x82) goto LAB_00115ee1;
            psVar11 = psVar11 + 1;
            uVar15 = (uint)sVar2;
          }
          iVar14 = iVar14 + uVar15;
          iVar6 = iVar14;
        }
LAB_00115ee1:
        sVar17 = sVar17 + 1;
      } while (iVar6 < local_c4);
      local_70._M_allocated_capacity = (size_type)(local_d7 + 1);
      local_70._8_8_ = &local_c0;
      local_60._M_allocated_capacity = (size_type)&local_c8;
      local_60._8_8_ = &local_c4;
      local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_d7;
      local_40._M_allocated_capacity = (size_type)(local_d7 + 3);
      local_40._8_8_ = local_d7 + 2;
      local_48 = (digit_grouping<char> *)local_b8;
      bVar7.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::big_decimal_fp,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::big_decimal_fp_const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_3_&>
                     (out,specs,sVar17,sVar17,(anon_class_64_8_e6ffa566 *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)auStack_a4._12_8_ != &local_88) {
        operator_delete((void *)auStack_a4._12_8_);
      }
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_b8 + 0x10);
    }
    else {
      lVar16 = uVar15 + uVar18;
      local_d4 = (byte  [4])(local_d0.precision - local_c4);
      if (((uint)local_d0._4_4_ >> 0x13 & 1) != 0) {
        if (local_d0._4_1_ != '\x02' && (int)local_d4 < 1) {
          local_d4[0] = 0;
          local_d4[1] = 0;
          local_d4[2] = 0;
          local_d4[3] = 0;
        }
        lVar16 = lVar16 + 1;
        if (0 < (long)(int)local_d4) {
          lVar16 = lVar16 + (int)local_d4;
        }
      }
      digit_grouping<char>::digit_grouping
                ((digit_grouping<char> *)&local_70,loc,
                 (bool)((byte)((uint)local_d0._4_4_ >> 0x11) & 1));
      sVar17 = lVar16 - 1;
      iVar14 = 0;
      uVar10 = local_70._0_8_;
      do {
        iVar6 = 0x7fffffff;
        if (local_48 != (digit_grouping<char> *)0x0) {
          if ((byte *)uVar10 == (byte *)(local_70._8_8_ + local_70._M_allocated_capacity)) {
            uVar15 = (uint)(char)((byte *)(local_70._8_8_ + local_70._M_allocated_capacity))[-1];
          }
          else {
            bVar5 = *(byte *)uVar10;
            if ((byte)(bVar5 + 0x81) < 0x82) goto LAB_00115c50;
            uVar10 = uVar10 + 1;
            uVar15 = (uint)bVar5;
          }
          iVar14 = iVar14 + uVar15;
          iVar6 = iVar14;
        }
LAB_00115c50:
        sVar17 = sVar17 + 1;
      } while (iVar6 < local_c4);
      local_b8._0_8_ = local_d7 + 1;
      local_b8._8_8_ = &local_c0;
      unique0x00004e80 = &local_c8;
      local_90 = (float_specs *)(local_d7 + 7);
      local_88._M_allocated_capacity = (size_type)local_d7;
      local_88._8_8_ = local_d7 + 3;
      local_78 = local_d7 + 2;
      auStack_a4._4_8_ = f;
      auStack_a4._12_8_ = &local_70;
      bVar7.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::big_decimal_fp,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::big_decimal_fp_const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_2_&>
                     (out,specs,sVar17,sVar17,(anon_class_72_9_0c6a3a8a *)local_b8);
      if (local_50 != &local_40) {
        operator_delete(local_50);
      }
      paVar8 = &local_60;
    }
    if (*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)(paVar8->_M_local_buf + -0x10) != paVar8) {
      operator_delete(*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        **)(paVar8->_M_local_buf + -0x10));
    }
  }
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)bVar7.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = fspecs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (fspecs.showpoint) {
      ++size;
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}